

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O3

void test_bson_utf8_get_char(void)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  size_t sVar5;
  undefined8 unaff_RBX;
  char **ppcVar6;
  int iStack_1c;
  short sStack_16;
  char cStack_14;
  code *pcStack_10;
  
  pcStack_10 = (code *)0x1372c8;
  iVar2 = bson_utf8_get_char("asdf");
  if (iVar2 == 0x61) {
    pcStack_10 = (code *)0x1372dd;
    unaff_RBX = bson_utf8_next_char("asdf");
    pcStack_10 = (code *)0x1372e8;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x73) goto LAB_001373e6;
    pcStack_10 = (code *)0x1372f9;
    unaff_RBX = bson_utf8_next_char(unaff_RBX);
    pcStack_10 = (code *)0x137304;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 100) goto LAB_001373eb;
    pcStack_10 = (code *)0x137315;
    unaff_RBX = bson_utf8_next_char(unaff_RBX);
    pcStack_10 = (code *)0x137320;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x66) goto LAB_001373f0;
    pcStack_10 = (code *)0x137331;
    pcVar3 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar3 != '\0') goto LAB_001373f5;
    pcStack_10 = (code *)0x137346;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2);
    if (iVar2 != 0x20ac) goto LAB_001373fa;
    pcStack_10 = (code *)0x13735d;
    puVar4 = (uchar *)bson_utf8_next_char(test_bson_utf8_get_char::test2);
    if (puVar4 != test_bson_utf8_get_char::test2 + 3) goto LAB_001373ff;
    pcStack_10 = (code *)0x137379;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2 + 3);
    if (iVar2 != 0x20) goto LAB_00137404;
    pcStack_10 = (code *)0x13738e;
    unaff_RBX = bson_utf8_next_char(test_bson_utf8_get_char::test2 + 3);
    pcStack_10 = (code *)0x137399;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00137409;
    pcStack_10 = (code *)0x1373a8;
    unaff_RBX = bson_utf8_next_char(unaff_RBX);
    pcStack_10 = (code *)0x1373b3;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20) goto LAB_0013740e;
    pcStack_10 = (code *)0x1373c0;
    unaff_RBX = bson_utf8_next_char(unaff_RBX);
    pcStack_10 = (code *)0x1373cb;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00137413;
    pcStack_10 = (code *)0x1373da;
    pcVar3 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar3 == '\0') {
      return;
    }
  }
  else {
    pcStack_10 = (code *)0x1373e6;
    test_bson_utf8_get_char_cold_1();
LAB_001373e6:
    pcStack_10 = (code *)0x1373eb;
    test_bson_utf8_get_char_cold_2();
LAB_001373eb:
    pcStack_10 = (code *)0x1373f0;
    test_bson_utf8_get_char_cold_3();
LAB_001373f0:
    pcStack_10 = (code *)0x1373f5;
    test_bson_utf8_get_char_cold_4();
LAB_001373f5:
    pcStack_10 = (code *)0x1373fa;
    test_bson_utf8_get_char_cold_5();
LAB_001373fa:
    pcStack_10 = (code *)0x1373ff;
    test_bson_utf8_get_char_cold_6();
LAB_001373ff:
    pcStack_10 = (code *)0x137404;
    test_bson_utf8_get_char_cold_7();
LAB_00137404:
    pcStack_10 = (code *)0x137409;
    test_bson_utf8_get_char_cold_8();
LAB_00137409:
    pcStack_10 = (code *)0x13740e;
    test_bson_utf8_get_char_cold_9();
LAB_0013740e:
    pcStack_10 = (code *)0x137413;
    test_bson_utf8_get_char_cold_10();
LAB_00137413:
    pcStack_10 = (code *)0x137418;
    test_bson_utf8_get_char_cold_11();
  }
  pcStack_10 = test_bson_utf8_from_unichar;
  test_bson_utf8_get_char_cold_12();
  pcStack_10 = (code *)unaff_RBX;
  bson_utf8_from_unichar(0,&sStack_16,&iStack_1c);
  if (iStack_1c == 1) {
    bson_utf8_from_unichar(0x80,&sStack_16,&iStack_1c);
    if (iStack_1c != 2) goto LAB_001376dc;
    bson_utf8_from_unichar(0x800,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_001376e1;
    bson_utf8_from_unichar(0x10000,&sStack_16,&iStack_1c);
    if (iStack_1c != 4) goto LAB_001376e6;
    bson_utf8_from_unichar(0x200000,&sStack_16,&iStack_1c);
    if (iStack_1c != 5) goto LAB_001376eb;
    bson_utf8_from_unichar(0x4000000,&sStack_16,&iStack_1c);
    if (iStack_1c != 6) goto LAB_001376f0;
    bson_utf8_from_unichar(0x7f,&sStack_16,&iStack_1c);
    if (iStack_1c != 1) goto LAB_001376f5;
    bson_utf8_from_unichar(0x7ff,&sStack_16,&iStack_1c);
    if (iStack_1c != 2) goto LAB_001376fa;
    bson_utf8_from_unichar(0xffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_001376ff;
    bson_utf8_from_unichar(0x1fffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 4) goto LAB_00137704;
    bson_utf8_from_unichar(0x3ffffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 5) goto LAB_00137709;
    bson_utf8_from_unichar(0x7fffffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 6) goto LAB_0013770e;
    bson_utf8_from_unichar(0xd7ff,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_00137713;
    bson_utf8_from_unichar(0xe000,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_00137718;
    bson_utf8_from_unichar(0xfffd,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_0013771d;
    bson_utf8_from_unichar(0x10ffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 4) goto LAB_00137722;
    bson_utf8_from_unichar(0x110000,&sStack_16,&iStack_1c);
    if (iStack_1c != 4) goto LAB_00137727;
    bson_utf8_from_unichar(0x61,&sStack_16,&iStack_1c);
    if (iStack_1c != 1) goto LAB_0013772c;
    if ((char)sStack_16 != 'a') goto LAB_00137731;
    bson_utf8_from_unichar(0xff,&sStack_16,&iStack_1c);
    if (iStack_1c != 2) goto LAB_00137736;
    if (sStack_16 != -0x403d) goto LAB_0013773b;
    bson_utf8_from_unichar(0x20ac,&sStack_16,&iStack_1c);
    if (iStack_1c == 3) {
      if (cStack_14 == -0x54 && sStack_16 == -0x7d1e) {
        return;
      }
      goto LAB_00137745;
    }
  }
  else {
    test_bson_utf8_from_unichar_cold_1();
LAB_001376dc:
    test_bson_utf8_from_unichar_cold_2();
LAB_001376e1:
    test_bson_utf8_from_unichar_cold_3();
LAB_001376e6:
    test_bson_utf8_from_unichar_cold_4();
LAB_001376eb:
    test_bson_utf8_from_unichar_cold_5();
LAB_001376f0:
    test_bson_utf8_from_unichar_cold_6();
LAB_001376f5:
    test_bson_utf8_from_unichar_cold_7();
LAB_001376fa:
    test_bson_utf8_from_unichar_cold_8();
LAB_001376ff:
    test_bson_utf8_from_unichar_cold_9();
LAB_00137704:
    test_bson_utf8_from_unichar_cold_10();
LAB_00137709:
    test_bson_utf8_from_unichar_cold_11();
LAB_0013770e:
    test_bson_utf8_from_unichar_cold_12();
LAB_00137713:
    test_bson_utf8_from_unichar_cold_13();
LAB_00137718:
    test_bson_utf8_from_unichar_cold_14();
LAB_0013771d:
    test_bson_utf8_from_unichar_cold_15();
LAB_00137722:
    test_bson_utf8_from_unichar_cold_16();
LAB_00137727:
    test_bson_utf8_from_unichar_cold_17();
LAB_0013772c:
    test_bson_utf8_from_unichar_cold_18();
LAB_00137731:
    test_bson_utf8_from_unichar_cold_19();
LAB_00137736:
    test_bson_utf8_from_unichar_cold_20();
LAB_0013773b:
    test_bson_utf8_from_unichar_cold_21();
  }
  test_bson_utf8_from_unichar_cold_22();
LAB_00137745:
  test_bson_utf8_from_unichar_cold_23();
  ppcVar6 = test_bson_utf8_non_shortest::tests;
  puVar4 = (uchar *)0x0;
  do {
    pcVar3 = *ppcVar6;
    sVar5 = strlen(pcVar3);
    cVar1 = bson_utf8_validate(pcVar3,sVar5,0);
    if (cVar1 != '\0') {
      test_bson_utf8_non_shortest_cold_2();
      goto LAB_001377a9;
    }
    puVar4 = (uchar *)((long)&((TestSuite *)puVar4)->prgname + 1);
    ppcVar6 = ppcVar6 + 1;
  } while ((TestSuite *)puVar4 != (TestSuite *)0x5);
  puVar4 = test_bson_utf8_validate::test2;
  cVar1 = bson_utf8_validate(test_bson_utf8_validate::test2,2,1);
  if (cVar1 != '\0') {
    return;
  }
LAB_001377a9:
  test_bson_utf8_non_shortest_cold_1();
  TestSuite_Add((TestSuite *)puVar4,"/bson/value/basic",test_value_basic);
  TestSuite_Add((TestSuite *)puVar4,"/bson/value/decimal128",test_value_decimal128);
  return;
}

Assistant:

static void
test_bson_utf8_get_char (void)
{
   static const char *test1 = "asdf";
   static const unsigned char test2[] = {
      0xe2, 0x82, 0xac, ' ', 0xe2, 0x82, 0xac, ' ', 0xe2, 0x82, 0xac, 0};
   const char *c;

   c = test1;
   BSON_ASSERT (bson_utf8_get_char (c) == 'a');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 's');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 'd');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 'f');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (!*c);

   c = (const char *) test2;
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (c == (const char *) test2 + 3);
   BSON_ASSERT (bson_utf8_get_char (c) == ' ');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == ' ');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (!*c);
}